

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZStructMatrixT.h
# Opt level: O1

int __thiscall TPZStructMatrixT<double>::ClassId(TPZStructMatrixT<double> *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"TPZStructMatrixT","");
  uVar1 = Hash(&local_40);
  iVar2 = TPZStructMatrix::ClassId(&this->super_TPZStructMatrix);
  iVar3 = ClassIdOrHash<double>();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return iVar3 << 2 ^ iVar2 * 2 ^ uVar1;
}

Assistant:

int ClassId() const override{
        return Hash("TPZStructMatrixT") ^
            TPZStructMatrix::ClassId() << 1 ^
            ClassIdOrHash<TVar>() << 2;
    }